

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::NavScoreItem(ImGuiNavItemData *result)

{
  uint uVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  ImRect *pIVar7;
  ImRect *pIVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  ImRect cand;
  
  pIVar3 = GImGui;
  pIVar7 = &cand;
  pIVar2 = GImGui->CurrentWindow;
  if (GImGui->NavLayer != (pIVar2->DC).NavLayerCurrent) {
    return false;
  }
  cand.Min = (GImGui->LastItemData).NavRect.Min;
  cand.Max = (GImGui->LastItemData).NavRect.Max;
  fVar10 = (GImGui->NavScoringRect).Min.x;
  fVar14 = (GImGui->NavScoringRect).Min.y;
  fVar9 = (GImGui->NavScoringRect).Max.x;
  fVar16 = (GImGui->NavScoringRect).Max.y;
  GImGui->NavScoringDebugCount = GImGui->NavScoringDebugCount + 1;
  if (pIVar2->ParentWindow == pIVar3->NavWindow) {
    bVar4 = ImRect::Overlaps(&pIVar2->ClipRect,&cand);
    if (!bVar4) {
      return false;
    }
    ImRect::ClipWithFull(&cand,&pIVar2->ClipRect);
  }
  if ((uint)pIVar3->NavMoveClipDir < 2) {
    pIVar7 = (ImRect *)&cand.Min.y;
    lVar6 = 0xc;
    pIVar8 = (ImRect *)&(pIVar2->ClipRect).Min.y;
  }
  else {
    lVar6 = 8;
    pIVar8 = &pIVar2->ClipRect;
  }
  fVar11 = *(float *)pIVar7;
  fVar12 = (pIVar8->Min).x;
  fVar13 = *(float *)((long)&(pIVar2->ClipRect).Min.x + lVar6);
  fVar15 = fVar13;
  if (fVar11 <= fVar13) {
    fVar15 = fVar11;
  }
  *(uint *)pIVar7 =
       -(uint)(fVar11 < fVar12) & (uint)fVar12 | ~-(uint)(fVar11 < fVar12) & (uint)fVar15;
  fVar11 = *(float *)((long)&cand.Min.x + lVar6);
  if (fVar11 <= fVar13) {
    fVar13 = fVar11;
  }
  *(uint *)((long)&cand.Min.x + lVar6) =
       -(uint)(fVar11 < fVar12) & (uint)fVar12 | ~-(uint)(fVar11 < fVar12) & (uint)fVar13;
  if (fVar10 <= cand.Max.x) {
    fVar11 = 0.0;
    if (fVar9 < cand.Min.x) {
      fVar11 = cand.Min.x - fVar9;
    }
  }
  else {
    fVar11 = cand.Max.x - fVar10;
  }
  fVar15 = fVar16 - fVar14;
  fVar12 = (cand.Max.y - cand.Min.y) * 0.8 + cand.Min.y;
  fVar13 = fVar15 * 0.2 + fVar14;
  if (fVar13 <= fVar12) {
    fVar12 = (cand.Max.y - cand.Min.y) * 0.2 + cand.Min.y;
    fVar13 = fVar15 * 0.8 + fVar14;
    if (fVar13 < fVar12) {
      fVar12 = fVar12 - fVar13;
      goto LAB_001d1b5a;
    }
    fVar12 = 0.0;
    bVar4 = false;
  }
  else {
    fVar12 = fVar12 - fVar13;
LAB_001d1b5a:
    bVar4 = fVar12 != 0.0;
    if (((fVar11 != 0.0) || (NAN(fVar11))) && ((fVar12 != 0.0 || (NAN(fVar12))))) {
      fVar11 = fVar11 / 1000.0 + *(float *)(&DAT_00224d98 + (ulong)(0.0 < fVar11) * 4);
      bVar4 = true;
    }
  }
  fVar9 = (cand.Min.x + cand.Max.x) - (fVar10 + fVar9);
  fVar10 = (cand.Min.y + cand.Max.y) - (fVar14 + fVar16);
  fVar14 = ABS(fVar12) + ABS(fVar11);
  fVar16 = ABS(fVar9) + ABS(fVar10);
  if (bVar4) {
LAB_001d1c1c:
    fVar10 = fVar12;
    fVar13 = fVar14;
    uVar5 = (uint)(0.0 < fVar11);
    fVar9 = fVar11;
    if (ABS(fVar11) <= ABS(fVar12)) {
      uVar5 = 0.0 < fVar12 | 2;
    }
  }
  else {
    if ((fVar11 != 0.0) || (NAN(fVar11))) goto LAB_001d1c1c;
    if ((((fVar9 != 0.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) {
      fVar13 = fVar16;
      uVar5 = 0.0 < fVar10 | 2;
      if (ABS(fVar10) < ABS(fVar9)) {
        uVar5 = (uint)(0.0 < fVar9);
      }
    }
    else {
      fVar10 = 0.0;
      fVar13 = 0.0;
      uVar5 = (uint)(pIVar3->NavId <= (pIVar3->LastItemData).ID);
      fVar9 = 0.0;
    }
  }
  uVar1 = pIVar3->NavMoveDir;
  fVar15 = result->DistBox;
  if (uVar5 == uVar1) {
    if (fVar14 < fVar15) {
      result->DistBox = fVar14;
      result->DistCenter = fVar16;
      return true;
    }
    if ((fVar14 == fVar15) && (!NAN(fVar14) && !NAN(fVar15))) {
      fVar14 = result->DistCenter;
      if (fVar16 < fVar14) {
        result->DistCenter = fVar16;
LAB_001d1cb9:
        bVar4 = true;
        goto LAB_001d1cbf;
      }
      if ((fVar16 == fVar14) && (!NAN(fVar16) && !NAN(fVar14))) {
        if ((uVar5 & 2) == 0) {
          fVar12 = fVar11;
        }
        if (fVar12 < 0.0) goto LAB_001d1cb9;
      }
    }
  }
  bVar4 = false;
LAB_001d1cbf:
  if (fVar15 != 3.4028235e+38) {
    return bVar4;
  }
  if (NAN(fVar15)) {
    return bVar4;
  }
  if (result->DistAxial <= fVar13) {
    return bVar4;
  }
  if (pIVar3->NavLayer == ImGuiNavLayer_Menu) {
    if ((pIVar3->NavWindow->Flags & 0x10000000) != 0) {
      return bVar4;
    }
    if ((((uVar1 != 0) || (0.0 <= fVar9)) && ((uVar1 != 1 || (fVar9 <= 0.0)))) &&
       ((uVar1 != 2 || (0.0 <= fVar10)))) {
      if (uVar1 != 3) {
        return bVar4;
      }
      if (fVar10 <= 0.0) {
        return bVar4;
      }
    }
    result->DistAxial = fVar13;
    return true;
  }
  return bVar4;
}

Assistant:

static bool ImGui::NavScoreItem(ImGuiNavItemData* result)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.NavLayer != window->DC.NavLayerCurrent)
        return false;

    // FIXME: Those are not good variables names
    ImRect cand = g.LastItemData.NavRect;   // Current item nav rectangle
    const ImRect curr = g.NavScoringRect;   // Current modified source rect (NB: we've applied Max.x = Min.x in NavUpdate() to inhibit the effect of having varied item width)
    g.NavScoringDebugCount++;

    // When entering through a NavFlattened border, we consider child window items as fully clipped for scoring
    if (window->ParentWindow == g.NavWindow)
    {
        IM_ASSERT((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened);
        if (!window->ClipRect.Overlaps(cand))
            return false;
        cand.ClipWithFull(window->ClipRect); // This allows the scored item to not overlap other candidates in the parent window
    }

    // We perform scoring on items bounding box clipped by the current clipping rectangle on the other axis (clipping on our movement axis would give us equal scores for all clipped items)
    // For example, this ensures that items in one column are not reached when moving vertically from items in another column.
    NavClampRectToVisibleAreaForMoveDir(g.NavMoveClipDir, cand, window->ClipRect);

    // Compute distance between boxes
    // FIXME-NAV: Introducing biases for vertical navigation, needs to be removed.
    float dbx = NavScoreItemDistInterval(cand.Min.x, cand.Max.x, curr.Min.x, curr.Max.x);
    float dby = NavScoreItemDistInterval(ImLerp(cand.Min.y, cand.Max.y, 0.2f), ImLerp(cand.Min.y, cand.Max.y, 0.8f), ImLerp(curr.Min.y, curr.Max.y, 0.2f), ImLerp(curr.Min.y, curr.Max.y, 0.8f)); // Scale down on Y to keep using box-distance for vertically touching items
    if (dby != 0.0f && dbx != 0.0f)
        dbx = (dbx / 1000.0f) + ((dbx > 0.0f) ? +1.0f : -1.0f);
    float dist_box = ImFabs(dbx) + ImFabs(dby);

    // Compute distance between centers (this is off by a factor of 2, but we only compare center distances with each other so it doesn't matter)
    float dcx = (cand.Min.x + cand.Max.x) - (curr.Min.x + curr.Max.x);
    float dcy = (cand.Min.y + cand.Max.y) - (curr.Min.y + curr.Max.y);
    float dist_center = ImFabs(dcx) + ImFabs(dcy); // L1 metric (need this for our connectedness guarantee)

    // Determine which quadrant of 'curr' our candidate item 'cand' lies in based on distance
    ImGuiDir quadrant;
    float dax = 0.0f, day = 0.0f, dist_axial = 0.0f;
    if (dbx != 0.0f || dby != 0.0f)
    {
        // For non-overlapping boxes, use distance between boxes
        dax = dbx;
        day = dby;
        dist_axial = dist_box;
        quadrant = ImGetDirQuadrantFromDelta(dbx, dby);
    }
    else if (dcx != 0.0f || dcy != 0.0f)
    {
        // For overlapping boxes with different centers, use distance between centers
        dax = dcx;
        day = dcy;
        dist_axial = dist_center;
        quadrant = ImGetDirQuadrantFromDelta(dcx, dcy);
    }
    else
    {
        // Degenerate case: two overlapping buttons with same center, break ties arbitrarily (note that LastItemId here is really the _previous_ item order, but it doesn't matter)
        quadrant = (g.LastItemData.ID < g.NavId) ? ImGuiDir_Left : ImGuiDir_Right;
    }

#if IMGUI_DEBUG_NAV_SCORING
    char buf[128];
    if (IsMouseHoveringRect(cand.Min, cand.Max))
    {
        ImFormatString(buf, IM_ARRAYSIZE(buf), "dbox (%.2f,%.2f->%.4f)\ndcen (%.2f,%.2f->%.4f)\nd (%.2f,%.2f->%.4f)\nnav %c, quadrant %c", dbx, dby, dist_box, dcx, dcy, dist_center, dax, day, dist_axial, "WENS"[g.NavMoveDir], "WENS"[quadrant]);
        ImDrawList* draw_list = GetForegroundDrawList(window);
        draw_list->AddRect(curr.Min, curr.Max, IM_COL32(255,200,0,100));
        draw_list->AddRect(cand.Min, cand.Max, IM_COL32(255,255,0,200));
        draw_list->AddRectFilled(cand.Max - ImVec2(4, 4), cand.Max + CalcTextSize(buf) + ImVec2(4, 4), IM_COL32(40,0,0,150));
        draw_list->AddText(cand.Max, ~0U, buf);
    }
    else if (g.IO.KeyCtrl) // Hold to preview score in matching quadrant. Press C to rotate.
    {
        if (quadrant == g.NavMoveDir)
        {
            ImFormatString(buf, IM_ARRAYSIZE(buf), "%.0f/%.0f", dist_box, dist_center);
            ImDrawList* draw_list = GetForegroundDrawList(window);
            draw_list->AddRectFilled(cand.Min, cand.Max, IM_COL32(255, 0, 0, 200));
            draw_list->AddText(cand.Min, IM_COL32(255, 255, 255, 255), buf);
        }
    }
#endif

    // Is it in the quadrant we're interested in moving to?
    bool new_best = false;
    const ImGuiDir move_dir = g.NavMoveDir;
    if (quadrant == move_dir)
    {
        // Does it beat the current best candidate?
        if (dist_box < result->DistBox)
        {
            result->DistBox = dist_box;
            result->DistCenter = dist_center;
            return true;
        }
        if (dist_box == result->DistBox)
        {
            // Try using distance between center points to break ties
            if (dist_center < result->DistCenter)
            {
                result->DistCenter = dist_center;
                new_best = true;
            }
            else if (dist_center == result->DistCenter)
            {
                // Still tied! we need to be extra-careful to make sure everything gets linked properly. We consistently break ties by symbolically moving "later" items
                // (with higher index) to the right/downwards by an infinitesimal amount since we the current "best" button already (so it must have a lower index),
                // this is fairly easy. This rule ensures that all buttons with dx==dy==0 will end up being linked in order of appearance along the x axis.
                if (((move_dir == ImGuiDir_Up || move_dir == ImGuiDir_Down) ? dby : dbx) < 0.0f) // moving bj to the right/down decreases distance
                    new_best = true;
            }
        }
    }

    // Axial check: if 'curr' has no link at all in some direction and 'cand' lies roughly in that direction, add a tentative link. This will only be kept if no "real" matches
    // are found, so it only augments the graph produced by the above method using extra links. (important, since it doesn't guarantee strong connectedness)
    // This is just to avoid buttons having no links in a particular direction when there's a suitable neighbor. you get good graphs without this too.
    // 2017/09/29: FIXME: This now currently only enabled inside menu bars, ideally we'd disable it everywhere. Menus in particular need to catch failure. For general navigation it feels awkward.
    // Disabling it may lead to disconnected graphs when nodes are very spaced out on different axis. Perhaps consider offering this as an option?
    if (result->DistBox == FLT_MAX && dist_axial < result->DistAxial)  // Check axial match
        if (g.NavLayer == ImGuiNavLayer_Menu && !(g.NavWindow->Flags & ImGuiWindowFlags_ChildMenu))
            if ((move_dir == ImGuiDir_Left && dax < 0.0f) || (move_dir == ImGuiDir_Right && dax > 0.0f) || (move_dir == ImGuiDir_Up && day < 0.0f) || (move_dir == ImGuiDir_Down && day > 0.0f))
            {
                result->DistAxial = dist_axial;
                new_best = true;
            }

    return new_best;
}